

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O3

void __thiscall
icu_63::DayPeriodRulesDataSink::put
          (DayPeriodRulesDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  undefined1 auVar1 [16];
  char *__s1;
  UBool UVar2;
  int iVar3;
  int iVar4;
  int32_t value_00;
  UMemory *this_00;
  undefined2 *puVar5;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  undefined2 *puVar6;
  int i;
  char *size;
  ulong uVar7;
  int32_t len;
  ResourceTable dayPeriodData;
  ResourceTable locales;
  ResourceTable rules;
  char *local_f0;
  int32_t local_e4;
  ConstChar16Ptr local_e0;
  DayPeriodRulesDataSink *local_d8;
  char16_t *local_d0;
  ResourceTable local_c0;
  ResourceTable local_98;
  UnicodeString local_70;
  
  local_f0 = key;
  local_d8 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_c0,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i = 0;
    UVar2 = ResourceTable::getKeyAndValue(&local_c0,0,&local_f0,value);
    if (UVar2 != '\0') {
      do {
        __s1 = local_f0;
        iVar3 = strcmp(local_f0,"locales");
        if (iVar3 == 0) {
          (*(value->super_UObject)._vptr_UObject[0xb])(&local_98,value,errorCode);
          if (U_ZERO_ERROR < *errorCode) {
            return;
          }
          UVar2 = ResourceTable::getKeyAndValue(&local_98,0,&local_f0,value);
          if (UVar2 != '\0') {
            iVar3 = 1;
            do {
              local_e4 = 0;
              iVar4 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_e4,errorCode);
              local_e0.p_ = (char16_t *)CONCAT44(extraout_var,iVar4);
              icu_63::UnicodeString::UnicodeString(&local_70,'\x01',&local_e0,local_e4);
              local_d0 = local_e0.p_;
              value_00 = parseSetNum(&local_70,errorCode);
              uhash_puti_63((UHashtable *)*(anonymous_namespace)::data,local_f0,value_00,errorCode);
              icu_63::UnicodeString::~UnicodeString(&local_70);
              UVar2 = ResourceTable::getKeyAndValue(&local_98,iVar3,&local_f0,value);
              iVar3 = iVar3 + 1;
            } while (UVar2 != '\0');
          }
        }
        else {
          size = "rules";
          iVar3 = strcmp(__s1,"rules");
          if (iVar3 == 0) {
            uVar7 = (long)*(int *)((anonymous_namespace)::data + 2) + 1;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = uVar7;
            this_00 = SUB168(auVar1 * ZEXT816(100),0);
            if (SUB168(auVar1 * ZEXT816(100),8) != 0) {
              this_00 = (UMemory *)0xffffffffffffffff;
            }
            puVar5 = (undefined2 *)UMemory::operator_new__(this_00,(size_t)size);
            if (puVar5 == (undefined2 *)0x0) {
              (anonymous_namespace)::data[1] = 0;
              *errorCode = U_MEMORY_ALLOCATION_ERROR;
              return;
            }
            if ((int)uVar7 != 0) {
              puVar6 = puVar5;
              do {
                *puVar6 = 0;
                *(undefined4 *)(puVar6 + 2) = 0xffffffff;
                *(undefined4 *)(puVar6 + 4) = 0xffffffff;
                *(undefined4 *)(puVar6 + 6) = 0xffffffff;
                *(undefined4 *)(puVar6 + 8) = 0xffffffff;
                *(undefined4 *)(puVar6 + 10) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0xc) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0xe) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x10) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x12) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x14) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x16) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x18) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x1a) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x1c) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x1e) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x20) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x22) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x24) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x26) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x28) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x2a) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x2c) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x2e) = 0xffffffff;
                *(undefined4 *)(puVar6 + 0x30) = 0xffffffff;
                puVar6 = puVar6 + 0x32;
              } while (puVar6 != puVar5 + uVar7 * 0x32);
            }
            (anonymous_namespace)::data[1] = puVar5;
            (*(value->super_UObject)._vptr_UObject[0xb])(&local_70,value,errorCode);
            processRules(local_d8,(ResourceTable *)&local_70,local_f0,value,errorCode);
            if (U_ZERO_ERROR < *errorCode) {
              return;
            }
          }
        }
        i = i + 1;
        UVar2 = ResourceTable::getKeyAndValue(&local_c0,i,&local_f0,value);
      } while (UVar2 != '\0');
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool, UErrorCode &errorCode) {
        ResourceTable dayPeriodData = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }

        for (int32_t i = 0; dayPeriodData.getKeyAndValue(i, key, value); ++i) {
            if (uprv_strcmp(key, "locales") == 0) {
                ResourceTable locales = value.getTable(errorCode);
                if (U_FAILURE(errorCode)) { return; }

                for (int32_t j = 0; locales.getKeyAndValue(j, key, value); ++j) {
                    UnicodeString setNum_str = value.getUnicodeString(errorCode);
                    int32_t setNum = parseSetNum(setNum_str, errorCode);
                    uhash_puti(data->localeToRuleSetNumMap, const_cast<char *>(key), setNum, &errorCode);
                }
            } else if (uprv_strcmp(key, "rules") == 0) {
                // Allocate one more than needed to skip [0]. See comment in parseSetNum().
                data->rules = new DayPeriodRules[data->maxRuleSetNum + 1];
                if (data->rules == NULL) {
                    errorCode = U_MEMORY_ALLOCATION_ERROR;
                    return;
                }
                ResourceTable rules = value.getTable(errorCode);
                processRules(rules, key, value, errorCode);
                if (U_FAILURE(errorCode)) { return; }
            }
        }
    }